

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::KillImplicitRegs(LinearScan *this,Instr *instr)

{
  code *pcVar1;
  IRKind IVar2;
  bool bVar3;
  RegNum RVar4;
  int iVar5;
  BVIndex BVar6;
  undefined4 *puVar7;
  bool local_61;
  Loop *local_58;
  Loop *loop;
  BVUnitT<unsigned_long> local_48;
  BitVector _unit;
  BVIndex reg;
  BVUnitT<unsigned_long> local_28;
  BitVector deadRegs;
  Instr *instr_local;
  LinearScan *this_local;
  
  deadRegs.word = (Type)instr;
  IVar2 = IR::Instr::GetKind(instr);
  local_61 = true;
  if (IVar2 != InstrKindLabel) {
    local_61 = IR::Instr::IsProfiledLabelInstr(instr);
  }
  if ((local_61 != false) || (bVar3 = IR::Instr::IsBranchInstr((Instr *)deadRegs.word), bVar3)) {
    BVUnitT<unsigned_long>::ClearAll(&this->tempRegs);
  }
  if (*(short *)(deadRegs.word + 0x30) == 0x419) {
    RVar4 = LowererMDArch::GetRegIMulHighDestLower();
    SpillReg(this,RVar4,false);
    RVar4 = LowererMDArch::GetRegIMulHighDestLower();
    BVUnitT<unsigned_long>::Clear(&this->tempRegs,(uint)RVar4);
    RVar4 = LowererMDArch::GetRegIMulHighDestLower();
    RecordLoopUse(this,(Lifetime *)0x0,RVar4);
  }
  else if (*(short *)(deadRegs.word + 0x30) == 0x25) {
    GeneratorBailIn::SpillRegsForBailIn(&this->bailIn);
  }
  else {
    TrackInlineeArgLifetimes(this,(Instr *)deadRegs.word);
    bVar3 = LowererMD::IsCall((Instr *)deadRegs.word);
    if ((!bVar3) && (bVar3 = IR::Instr::HasBailOutInfo((Instr *)deadRegs.word), bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xd1f,"(LowererMD::IsCall(instr) || !instr->HasBailOutInfo())",
                         "LowererMD::IsCall(instr) || !instr->HasBailOutInfo()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar3 = LowererMD::IsCall((Instr *)deadRegs.word);
    if ((bVar3) &&
       ((bVar3 = IR::Instr::HasBailOutInfo((Instr *)deadRegs.word), !bVar3 ||
        (bVar3 = IR::Instr::HasLazyBailOut((Instr *)deadRegs.word), bVar3)))) {
      iVar5 = JsUtil::ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                        (&(this->currentBlock->inlineeStack).
                          super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>);
      if (iVar5 < 1) {
        *(Func **)(deadRegs.word + 0x20) = this->func;
      }
      else {
        SpillInlineeArgs(this,(Instr *)deadRegs.word);
      }
      BVUnitT<unsigned_long>::BVUnitT(&local_28,0);
      BVUnitT<unsigned_long>::Copy(&local_28,(BVUnitT<unsigned_long>)(this->activeRegs).word);
      BVUnitT<unsigned_long>::And(&local_28,(BVUnitT<unsigned_long>)(this->callerSavedRegs).word);
      local_48.word = local_28.word;
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit(&local_48);
      while (_unit.word._4_4_ != 0xffffffff) {
        BVUnitT<unsigned_long>::Clear(&local_48,_unit.word._4_4_);
        SpillReg(this,(RegNum)_unit.word._4_4_,false);
        _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit(&local_48);
      }
      BVUnitT<unsigned_long>::And
                (&this->tempRegs,(BVUnitT<unsigned_long>)(this->calleeSavedRegs).word);
      BVar6 = BVUnitT<unsigned_long>::Count(&this->callSetupRegs);
      if (BVar6 != 0) {
        BVUnitT<unsigned_long>::ClearAll(&this->callSetupRegs);
      }
      for (local_58 = this->curLoop; local_58 != (Loop *)0x0; local_58 = local_58->parent) {
        BVUnitT<unsigned_long>::Or
                  (&(local_58->regAlloc).regUseBv,
                   (BVUnitT<unsigned_long>)(this->callerSavedRegs).word);
      }
    }
  }
  return;
}

Assistant:

void
LinearScan::KillImplicitRegs(IR::Instr *instr)
{
    if (instr->IsLabelInstr() || instr->IsBranchInstr())
    {
        // Note: need to clear these for branch as well because this info isn't recorded for second chance
        //       allocation on branch boundaries
        this->tempRegs.ClearAll();
    }

#if defined(_M_IX86) || defined(_M_X64)
    if (instr->m_opcode == Js::OpCode::IMUL)
    {
        this->SpillReg(LowererMDArch::GetRegIMulHighDestLower());
        this->tempRegs.Clear(LowererMDArch::GetRegIMulHighDestLower());

        this->RecordLoopUse(nullptr, LowererMDArch::GetRegIMulHighDestLower());
        return;
    }

    if (instr->m_opcode == Js::OpCode::Yield)
    {
        this->bailIn.SpillRegsForBailIn();
        return;
    }
#endif

    this->TrackInlineeArgLifetimes(instr);

    // Don't care about kills on bailout calls (e.g: call SaveAllRegAndBailOut) as we are going to exit anyways.
    // Note that those are different from normal helper calls with LazyBailOut because they are not guaranteed to exit.
    // Also, for bailout scenarios we have already handled the inlinee frame spills.
    // 
    // Lazy bailout:
    // Also make sure that Call instructions that previously do not have bailouts are still processed the same way in RegAlloc
    // Previously only `call SaveAllRegistersAndBailOut` can have bailout, but now other calls may have lazy bailouts too.
    // This makes them not being processed the same way as before(such as computing Lifetime across calls).
    Assert(LowererMD::IsCall(instr) || !instr->HasBailOutInfo());
    if (!LowererMD::IsCall(instr) || (instr->HasBailOutInfo() && !instr->HasLazyBailOut()))
    {
        return;
    }

    if (this->currentBlock->inlineeStack.Count() > 0)
    {
        this->SpillInlineeArgs(instr);
    }
    else
    {
        instr->m_func = this->func;
    }

    //
    // Spill caller-saved registers that are active.
    //
    BitVector deadRegs;
    deadRegs.Copy(this->activeRegs);
    deadRegs.And(this->callerSavedRegs);
    FOREACH_BITSET_IN_UNITBV(reg, deadRegs, BitVector)
    {
        this->SpillReg((RegNum)reg);
    }
    NEXT_BITSET_IN_UNITBV;
    this->tempRegs.And(this->calleeSavedRegs);

    if (callSetupRegs.Count())
    {
        callSetupRegs.ClearAll();
    }
    Loop *loop = this->curLoop;
    while (loop)
    {
        loop->regAlloc.regUseBv.Or(this->callerSavedRegs);
        loop = loop->parent;
    }
}